

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsHasOwnItem(JsValueRef object,uint32_t index,bool *hasOwnItem)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  JsErrorCode JVar2;
  BOOL BVar3;
  JsrtContext *currentContext;
  RecyclableObject *pRVar4;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_60 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar2 = CheckContext(currentContext,true,false);
  if (JVar2 != JsNoError) {
    return JVar2;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_98 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_60,scriptContext,(ScriptEntryExitRecord *)auStack_98,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_60);
  if (object == (JsValueRef)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    BVar3 = Js::JavascriptOperators::IsObject(object);
    if (BVar3 == 0) {
      JVar2 = JsErrorArgumentNotObject;
    }
    else {
      pRVar4 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar2 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003c1fb8;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
      }
      if (hasOwnItem == (bool *)0x0) {
        JVar2 = JsErrorNullArgument;
      }
      else {
        pRVar4 = Js::VarTo<Js::RecyclableObject>(object);
        BVar3 = Js::JavascriptOperators::HasOwnItem(pRVar4,index);
        *hasOwnItem = BVar3 != 0;
        JVar2 = JsNoError;
      }
    }
  }
LAB_003c1fb8:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_60);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  return JVar2;
}

Assistant:

CHAKRA_API
JsHasOwnItem(_In_ JsValueRef object,
    _In_ uint32_t index,
    _Out_ bool* hasOwnItem)
{
  return ContextAPIWrapper<true>(
      [&](Js::ScriptContext* scriptContext,
          TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(hasOwnItem);

        *hasOwnItem = !!Js::JavascriptOperators::HasOwnItem(
            Js::VarTo<Js::RecyclableObject>(object), index);

        return JsNoError;
      });
}